

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

ArrayRef<double> * __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::RecomputeAuxVars(SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   *this,ArrayRef<double> *x,vector<bool,_std::allocator<bool>_> *is_final)

{
  int iVar1;
  ModelType *pMVar2;
  VarVecRecomp *pVVar3;
  VarVecRecomp *in_RCX;
  long in_RSI;
  ArrayRef<double> *in_RDI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  int i;
  VarInfoRecomp vir;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb8;
  vector<double,_std::allocator<double>_> *other;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  ArrayRef<mp::var::Type> *in_stack_fffffffffffffcd8;
  VarInfoImpl<mp::VarVecRecomp> *this_01;
  undefined4 in_stack_fffffffffffffce8;
  ArrayRef<double> *in_stack_fffffffffffffcf8;
  vector<bool,_std::allocator<bool>_> *pvVar4;
  VarsRecomputeFn *in_stack_fffffffffffffd00;
  VarInfoRecomp *this_02;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd08;
  int iVar5;
  ArrayRef<double> *pAVar6;
  int local_2bc;
  vector<double,_std::allocator<double>_> local_2b8 [2];
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffd78;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffd80;
  VarInfoRecomp local_268;
  VarInfoImpl<mp::VarVecRecomp> local_140;
  
  pAVar6 = in_RDI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::sol_feas_tol((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)(in_RSI + -0x250));
  iVar5 = (int)in_RDI;
  mp::ArrayRef::operator_cast_to_vector(in_stack_fffffffffffffcf8);
  std::function<double_(int,_const_mp::VarInfoRecomp_&)>::function
            ((function<double_(int,_const_mp::VarInfoRecomp_&)> *)
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             (function<double_(int,_const_mp::VarInfoRecomp_&)> *)
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  VarVecRecomp::VarVecRecomp
            (in_RCX,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffcf8);
  pvVar4 = &local_268.super_VarInfoRecompTypedef.x_.is_recomp_;
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(in_RSI + -0x250);
  pMVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::GetModel(this_00);
  FlatModel<mp::DefaultFlatModelParams>::var_type_vec(pMVar2);
  this_02 = &local_268;
  ArrayRef<mp::var::Type>::ArrayRef
            ((ArrayRef<mp::var::Type> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (vector<mp::var::Type,_std::allocator<mp::var::Type>_> *)in_stack_fffffffffffffcb8);
  pMVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::GetModel(this_00);
  FlatModel<mp::DefaultFlatModelParams>::var_lb_vec(pMVar2);
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8);
  pMVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::GetModel(this_00);
  FlatModel<mp::DefaultFlatModelParams>::var_ub_vec(pMVar2);
  other = local_2b8;
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8);
  iVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::sol_round(this_00);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::sol_prec(this_00);
  VarInfoRecomp::VarInfoImpl
            (this_02,(double)pvVar4,SUB81((ulong)other >> 0x38,0),
             (VarVecRecomp *)CONCAT44(iVar1,in_stack_fffffffffffffce8),(ArrayRef<double> *)this_00,
             in_stack_fffffffffffffcd8,
             (ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             (ArrayRef<double> *)in_RCX,iVar5,(int)pAVar6);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15ece7);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15ecf4);
  ArrayRef<mp::var::Type>::~ArrayRef((ArrayRef<mp::var::Type> *)0x15ed01);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15ed0e);
  VarVecRecomp::~VarVecRecomp((VarVecRecomp *)CONCAT44(in_stack_fffffffffffffcc4,iVar1));
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x15ed28)
  ;
  std::function<double_(int,_const_mp::VarInfoRecomp_&)>::~function
            ((function<double_(int,_const_mp::VarInfoRecomp_&)> *)0x15ed35);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  this_01 = &local_140;
  pVVar3 = VarInfoImpl<mp::VarVecRecomp>::get_x(this_01);
  VarVecRecomp::set_p_var_info(pVVar3,(VarInfoRecomp *)this_01);
  local_2bc = VarInfoImpl<mp::VarVecRecomp>::size((VarInfoImpl<mp::VarVecRecomp> *)0x15ed70);
  while (local_2bc != 0) {
    VarInfoImpl<mp::VarVecRecomp>::operator[]
              ((VarInfoImpl<mp::VarVecRecomp> *)CONCAT44(in_stack_fffffffffffffcc4,iVar1),
               (int)((ulong)other >> 0x20));
    local_2bc = local_2bc + -1;
  }
  pVVar3 = VarInfoImpl<mp::VarVecRecomp>::get_x(&local_140);
  VarVecRecomp::get_x(pVVar3);
  ArrayRef<double>::ArrayRef((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffcc4,iVar1),other);
  VarInfoRecomp::~VarInfoRecomp((VarInfoRecomp *)0x15eeca);
  return pAVar6;
}

Assistant:

ArrayRef<double> RecomputeAuxVars(
      ArrayRef<double> x, std::vector<bool> is_final={}) {
    VarInfoRecomp vir {
      MPCD( sol_feas_tol() ),
          true,        // currently not relevant for recomputation
      {x, recomp_fn, is_final},
      {},              // no raw values
      MPCD( GetModel() ).var_type_vec(),
          MPCD( GetModel() ).var_lb_vec(),
          MPCD( GetModel() ).var_ub_vec(),
          MPCD( sol_round() ), MPCD( sol_prec() )
    };
    vir.get_x().set_p_var_info(&vir);
    for (auto i=vir.size(); i--; )
      vir[i];         // touch the variable to be recomputed
    return std::move(vir.get_x().get_x());
  }